

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O0

uint64_t safe_div_uint64_int64(uint64_t a,int64_t b)

{
  char *pcVar1;
  ulong in_RSI;
  char *in_RDI;
  uint64_t tmp;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    safe_math_fail(in_RDI);
  }
  if (in_RDI == (char *)0x0) {
    local_8 = 0;
  }
  else if ((long)in_RSI < 1) {
    pcVar1 = (char *)safe_abs64(in_RSI);
    if (pcVar1 <= in_RDI) {
      safe_math_fail(in_RDI);
    }
    local_8 = 0;
  }
  else {
    local_8 = (ulong)in_RDI / in_RSI;
  }
  return local_8;
}

Assistant:

static inline uint64_t safe_div_uint64_int64(uint64_t a, int64_t b)
{
    // Follow original SafeInt logic for this case
    if (b == 0) // div 0 always a problem
    {
        safe_math_fail("safe_math_fail safe_div_int64_int32");
    }

    if (a == 0) // zero divided by anything is zero
    {
        return 0;
    }

    if (b > 0) // if b is positive, just do the math
    {
        return a / (uint64_t)b;
    }
    else // now have to check magnitude
    {
        uint64_t tmp = safe_abs64(b);

        if (a < tmp)
        {
            return 0;
        }
    }

    safe_math_fail("safe_math_fail safe_div_int64_int32");
}